

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t get_pure_rep_price(lzma_lzma1_encoder *coder,uint32_t rep_index,lzma_lzma_state state,
                           uint32_t pos_state)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t local_20;
  uint32_t price;
  uint32_t pos_state_local;
  lzma_lzma_state state_local;
  uint32_t rep_index_local;
  lzma_lzma1_encoder *coder_local;
  
  if (rep_index == 0) {
    uVar1 = rc_bit_0_price(coder->is_rep0[state]);
    local_20 = rc_bit_1_price(coder->is_rep0_long[state][pos_state]);
    local_20 = local_20 + uVar1;
  }
  else {
    uVar1 = rc_bit_1_price(coder->is_rep0[state]);
    if (rep_index == 1) {
      local_20 = rc_bit_0_price(coder->is_rep1[state]);
      local_20 = local_20 + uVar1;
    }
    else {
      uVar2 = rc_bit_1_price(coder->is_rep1[state]);
      local_20 = rc_bit_price(coder->is_rep2[state],rep_index - 2);
      local_20 = local_20 + uVar2 + uVar1;
    }
  }
  return local_20;
}

Assistant:

static inline uint32_t
get_pure_rep_price(const lzma_lzma1_encoder *const coder, const uint32_t rep_index,
		const lzma_lzma_state state, uint32_t pos_state)
{
	uint32_t price;

	if (rep_index == 0) {
		price = rc_bit_0_price(coder->is_rep0[state]);
		price += rc_bit_1_price(coder->is_rep0_long[state][pos_state]);
	} else {
		price = rc_bit_1_price(coder->is_rep0[state]);

		if (rep_index == 1) {
			price += rc_bit_0_price(coder->is_rep1[state]);
		} else {
			price += rc_bit_1_price(coder->is_rep1[state]);
			price += rc_bit_price(coder->is_rep2[state],
					rep_index - 2);
		}
	}

	return price;
}